

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitSop.c
# Opt level: O1

void Kit_SopDup(Kit_Sop_t *cResult,Kit_Sop_t *cSop,Vec_Int_t *vMemory)

{
  uint uVar1;
  uint *puVar2;
  int iVar3;
  long lVar4;
  uint *puVar5;
  
  cResult->nCubes = 0;
  uVar1 = cSop->nCubes;
  if ((ulong)uVar1 != 0) {
    if ((int)uVar1 < 1) {
      __assert_fail("nWords > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x3a5,"unsigned int *Vec_IntFetch(Vec_Int_t *, int)");
    }
    lVar4 = (long)(int)uVar1 + (long)vMemory->nSize;
    iVar3 = (int)lVar4;
    vMemory->nSize = iVar3;
    if (iVar3 <= vMemory->nCap) {
      puVar5 = (uint *)(vMemory->pArray + (lVar4 - (ulong)uVar1));
      goto LAB_005d88af;
    }
  }
  puVar5 = (uint *)0x0;
LAB_005d88af:
  cResult->pCubes = puVar5;
  if (0 < cSop->nCubes) {
    puVar2 = cSop->pCubes;
    lVar4 = 0;
    do {
      uVar1 = puVar2[lVar4];
      if (uVar1 == 0) {
        return;
      }
      iVar3 = cResult->nCubes;
      cResult->nCubes = iVar3 + 1;
      puVar5[iVar3] = uVar1;
      lVar4 = lVar4 + 1;
    } while (lVar4 < cSop->nCubes);
  }
  return;
}

Assistant:

void Kit_SopDup( Kit_Sop_t * cResult, Kit_Sop_t * cSop, Vec_Int_t * vMemory )
{
    unsigned uCube;
    int i;
    // start the cover
    cResult->nCubes = 0;
    cResult->pCubes = Vec_IntFetch( vMemory, Kit_SopCubeNum(cSop) );
    // add the cubes
    Kit_SopForEachCube( cSop, uCube, i )
        Kit_SopPushCube( cResult, uCube );
}